

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O3

Self * __thiscall
draco::PointAttributeVectorOutputIterator<unsigned_int>::operator=
          (PointAttributeVectorOutputIterator<unsigned_int> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  uint uVar1;
  PointAttribute *pPVar2;
  pointer ptVar3;
  size_t sVar4;
  ulong uVar5;
  pointer __dest;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  
  ptVar3 = (this->attributes_).
           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->attributes_).
      super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ptVar3) {
    uVar6 = 0;
    do {
      pPVar2 = ptVar3[uVar6].
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
      uVar5 = (ulong)(this->point_id_).value_;
      if (pPVar2->identity_mapping_ == false) {
        uVar5 = (ulong)(pPVar2->indices_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
      }
      if (pPVar2->num_unique_entries_ <= (uint)uVar5) {
        return this;
      }
      ptVar3 = ptVar3 + uVar6;
      uVar1 = (ptVar3->
              super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
              ).super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.
              super__Head_base<3UL,_unsigned_int,_false>._M_head_impl;
      sVar4 = (size_t)uVar1;
      puVar8 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start +
               (ptVar3->
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               ).super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
               super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
      __dest = puVar8;
      if ((uVar1 < 4) &&
         (__dest = (pointer)this->data_,
         (ptVar3->
         super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
         ).super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
         super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
         super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<4UL,_unsigned_int>.
         super__Head_base<4UL,_unsigned_int,_false>._M_head_impl != 0)) {
        uVar7 = 0;
        do {
          memcpy(__dest,puVar8 + uVar7,sVar4);
          uVar7 = uVar7 + 1;
          sVar4 = (size_t)(ptVar3->
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                          ).
                          super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                          .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
                          super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.
                          super__Head_base<3UL,_unsigned_int,_false>._M_head_impl;
          __dest = (pointer)((long)__dest + sVar4);
        } while (uVar7 < (ptVar3->
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                         ).
                         super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                         .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
                         super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.
                         super__Tuple_impl<4UL,_unsigned_int>.
                         super__Head_base<4UL,_unsigned_int,_false>._M_head_impl);
        __dest = (pointer)this->data_;
      }
      sVar4 = (pPVar2->super_GeometryAttribute).byte_stride_;
      memcpy((void *)(uVar5 * sVar4 +
                     (long)(((pPVar2->super_GeometryAttribute).buffer_)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start),__dest,sVar4);
      uVar6 = uVar6 + 1;
      ptVar3 = (this->attributes_).
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->attributes_).
                     super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3 >> 3) *
              -0x5555555555555555;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  return this;
}

Assistant:

const Self &operator=(const std::vector<CoeffT> &val) {
    for (auto index = 0; index < attributes_.size(); index++) {
      AttributeTuple &att = attributes_[index];
      PointAttribute *attribute = std::get<0>(att);
      const AttributeValueIndex avi = attribute->mapped_index(point_id_);
      if (avi >= static_cast<uint32_t>(attribute->size())) {
        return *this;
      }
      const uint32_t &offset = std::get<1>(att);
      const uint32_t &data_size = std::get<3>(att);
      const uint32_t &num_components = std::get<4>(att);
      const uint32_t *data_source = val.data() + offset;
      if (data_size < 4) {  // handle uint16_t, uint8_t
        // selectively copy data bytes
        uint8_t *data_counter = data_;
        for (uint32_t index = 0; index < num_components;
             index += 1, data_counter += data_size) {
          std::memcpy(data_counter, data_source + index, data_size);
        }
        // redirect to copied data
        data_source = reinterpret_cast<uint32_t *>(data_);
      }
      attribute->SetAttributeValue(avi, data_source);
    }
    return *this;
  }